

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  ImU32 IVar1;
  uint *puVar2;
  ImGuiID id;
  ImGuiID seed;
  void *ptr_local;
  ImGuiWindow *this_local;
  
  _id = ptr;
  ptr_local = this;
  puVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  IVar1 = ImHashData(&id,8,*puVar2);
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_Pointer, ptr);
#endif
    return id;
}